

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMonitor.cpp
# Opt level: O2

void __thiscall SAXErrorHandler::fatalError(SAXErrorHandler *this,SAXParseException *exc)

{
  ostream *poVar1;
  wchar16 *pwVar2;
  char *local_20;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"SAX fatalError received!  Text:  ");
  pwVar2 = (wchar16 *)(**(code **)(*(long *)exc + 0x10))(exc);
  local_20 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  poVar1 = std::operator<<(poVar1,local_20);
  poVar1 = std::operator<<(poVar1,".");
  std::endl<char,std::char_traits<char>>(poVar1);
  xercesc_4_0::XMLString::release(&local_20,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void fatalError(const SAXParseException &exc )
    {
        char *message = 0;
        std::cerr << "SAX fatalError received!  Text:  " <<
            (message = XMLString::transcode(exc.getMessage())) << "." << std::endl;
        XMLString::release(&message);
    }